

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O3

void __thiscall DataServer::operator()(DataServer *this)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  __mode_t __mode;
  unique_lock<std::mutex> *__path;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_40;
  
  do {
    local_40._M_device = &nd_m;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    __path = &local_40;
    std::condition_variable::operator()
              ((condition_variable *)nd_cv,&local_40,(anon_class_8_1_8991fb9c)this);
    if (ispropercmd == true) {
      switch(type) {
      case put:
      case put2:
        saveFile(this);
        break;
      case read:
      case read2:
        if ((is_ready_read == true) && (server_executing_read == this->serverId)) {
          readFileAndOutput(this);
        }
        break;
      case mkdir:
        mkdir(this,(char *)__path,__mode);
      }
    }
    iVar1 = this->serverId;
    iVar3 = iVar1 + 0x3f;
    if (-1 < (long)iVar1) {
      iVar3 = iVar1;
    }
    bVar2 = (byte)iVar1 & 0x3f;
    dataNotified.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p
    [(long)(iVar3 >> 6) + ((ulong)(((long)iVar1 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
         dataNotified.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p
         [(long)(iVar3 >> 6) +
          ((ulong)(((long)iVar1 & 0x800000000000003fU) < 0x8000000000000001) - 1)] &
         (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    std::unique_lock<std::mutex>::unlock(&local_40);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  } while( true );
}

Assistant:

void operator() () const
    {
        for (;;)
        {
            unique_lock<mutex> lk(nd_m);
            nd_cv.wait(lk, [this]{return dataNotified[serverId];});

            if (ispropercmd && (type == MsgType::put || type == MsgType::put2))
            {
                saveFile();
            }
            else if (ispropercmd && (type == MsgType::read || type == MsgType::read2)){

                if (is_ready_read && server_executing_read == serverId)
                {
                    //cout << "is ready read and my id is " << serverId << endl;
                    readFileAndOutput();
                }
            }
            else if (ispropercmd && type == MsgType::mkdir)
            {
                mkdir();
            }
            //cout << serverId << " data notified \n";
            dataNotified[serverId] = false;
            lk.unlock();
            nd_cv.notify_all();
        }

    }